

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOstreamBuffer.cpp
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_27c2e2::TestcaseBase::toString<double>
          (string *__return_storage_ptr__,TestcaseBase *this,double t)

{
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  binlog::detail::OstreamBuffer::operator<<(&this->buf,t);
  (anonymous_namespace)::TestcaseBase::result_abi_cxx11_(__return_storage_ptr__,this);
  local_30 = local_20;
  local_28 = 0;
  local_20[0] = 0;
  std::__cxx11::stringbuf::str((string *)&this->field_0x8);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(T t)
  {
    buf << t;
    std::string s = result();
    str.str({}); // clear ostream
    return s;
  }